

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O0

int __thiscall r_file::open(r_file *this,char *__file,int __oflag,...)

{
  char *__filename;
  char *__modes;
  FILE *pFVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_21;
  undefined8 local_20;
  string *mode_local;
  string *path_local;
  r_file *obj;
  
  local_21 = 0;
  local_20 = ___oflag;
  mode_local = (string *)__file;
  path_local = (string *)this;
  r_file(this);
  __filename = (char *)std::__cxx11::string::c_str();
  __modes = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,__modes);
  this->_f = (FILE *)pFVar1;
  if (this->_f != (FILE *)0x0) {
    return (int)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_58,"Unable to open: ",mode_local);
  std::runtime_error::runtime_error(this_00,(string *)&local_58);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

r_file r_file::open(const string& path, const string& mode)
{
    r_file obj;
    obj._f = fopen(path.c_str(), mode.c_str());
    if(!obj._f)
        throw runtime_error("Unable to open: " + path);
    return obj;
}